

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::
     pnext_chain_add_json_value<VkRenderPassCreateInfo2,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (Value *base,VkRenderPassCreateInfo2 *t,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               DynamicStateInfo *dynamic_state_info)

{
  bool bVar1;
  GenericStringRef<char> local_58;
  uint local_44;
  undefined1 local_40 [8];
  Value nexts;
  DynamicStateInfo *dynamic_state_info_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkRenderPassCreateInfo2 *t_local;
  Value *base_local;
  
  if (t->pNext != (void *)0x0) {
    nexts.data_.o.members = (Member *)dynamic_state_info;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_40);
    bVar1 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (t->pNext,alloc,(Value *)local_40,(DynamicStateInfo *)nexts.data_.o.members);
    if (bVar1) {
      rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_58,(char (*) [6])"pNext");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(base,&local_58,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,alloc);
    }
    else {
      base_local._7_1_ = 0;
    }
    local_44 = (uint)!bVar1;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40);
    if (local_44 != 0) goto LAB_001331a4;
  }
  base_local._7_1_ = 1;
LAB_001331a4:
  return (bool)(base_local._7_1_ & 1);
}

Assistant:

static bool pnext_chain_add_json_value(Value &base, const T &t, Allocator &alloc,
                                       const DynamicStateInfo *dynamic_state_info)
{
	if (t.pNext)
	{
		Value nexts;
		if (!pnext_chain_json_value(t.pNext, alloc, &nexts, dynamic_state_info))
			return false;
		base.AddMember("pNext", nexts, alloc);
	}
	return true;
}